

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O0

void conn_port_to_str(uint16_t port,char *result)

{
  char local_1b;
  ushort local_1a;
  uint8_t n;
  char *pcStack_18;
  uint16_t port_tmp;
  char *result_local;
  uint16_t port_local;
  
  local_1b = '\0';
  local_1a = port;
  do {
    local_1b = local_1b + '\x01';
    local_1a = local_1a / 10;
  } while (local_1a != 0);
  local_1a = port;
  pcStack_18 = result;
  switch(local_1b) {
  case '\x05':
    *result = (char)((ulong)port / 10000) + '0';
    local_1a = port % 10000;
    pcStack_18 = result + 1;
  case '\x04':
    *pcStack_18 = (char)((ulong)local_1a / 1000) + '0';
    local_1a = local_1a % 1000;
    pcStack_18 = pcStack_18 + 1;
  case '\x03':
    *pcStack_18 = (char)((ulong)local_1a / 100) + '0';
    local_1a = local_1a % 100;
    pcStack_18 = pcStack_18 + 1;
  case '\x02':
    *pcStack_18 = (char)((ulong)local_1a / 10) + '0';
    local_1a = local_1a % 10;
    pcStack_18 = pcStack_18 + 1;
  case '\x01':
    *pcStack_18 = (char)local_1a + '0';
    pcStack_18 = pcStack_18 + 1;
  default:
    *pcStack_18 = '\0';
    return;
  }
}

Assistant:

void conn_port_to_str(uint16_t port, char result[6])
{
	uint16_t port_tmp = port;
	uint8_t n = 0;

	do {
		n++;
		port_tmp /= 10;
	} while (port_tmp != 0);

	port_tmp = port;

	switch (n) {
	case 5:
		*result = (char)(48 + port_tmp / 10000);
		port_tmp %= 10000;
		result++;
		/* fall through */
	case 4:
		*result = (char)(48 + port_tmp / 1000);
		port_tmp %= 1000;
		result++;
		/* fall through */
	case 3:
		*result = (char)(48 + port_tmp / 100);
		port_tmp %= 100;
		result++;
		/* fall through */
	case 2:
		*result = (char)(48 + port_tmp / 10);
		port_tmp %= 10;
		result++;
		/* fall through */
	case 1:
		*result = (char)(48 + port_tmp);
		result++;
	}

	*result = '\0';
}